

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bundle.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Bundle::AddPDU(Bundle *this,PduPtr *H)

{
  KException *this_00;
  KUINT16 KVar1;
  ushort uVar2;
  allocator<char> local_39;
  KString local_38;
  
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>
  ::push_back(&this->m_vRefHeaders,H);
  KVar1 = Header6::GetPDULength(&H->m_pRef->super_Header6);
  uVar2 = KVar1 + this->m_ui16Length;
  this->m_ui16Length = uVar2;
  if (uVar2 < 0x2001) {
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"AddPDU",&local_39);
  KException::KException(this_00,&local_38,0xb);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Bundle::AddPDU(PduPtr H) noexcept(false)
{
    m_vRefHeaders.push_back( H );
    m_ui16Length += H->GetPDULength();
    if( m_ui16Length > MAX_PDU_SIZE )throw KException( __FUNCTION__, PDU_TOO_LARGE );
}